

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replacement_scan.hpp
# Opt level: O1

string * duckdb::ReplacementScan::GetFullPath
                   (string *__return_storage_ptr__,string *catalog,string *schema,string *table)

{
  pointer pcVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (catalog->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + catalog->_M_string_length);
  if (schema->_M_string_length != 0) {
    pcVar2 = ".";
    if (__return_storage_ptr__->_M_string_length == 0) {
      pcVar2 = anon_var_dwarf_647c332 + 9;
    }
    ::std::operator+(&local_40,pcVar2,schema);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  pcVar2 = ".";
  if (__return_storage_ptr__->_M_string_length == 0) {
    pcVar2 = anon_var_dwarf_647c332 + 9;
  }
  ::std::operator+(&local_40,pcVar2,table);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string GetFullPath(const string &catalog, const string &schema, const string &table) {
		string table_name = catalog;
		if (!schema.empty()) {
			table_name += (!table_name.empty() ? "." : "") + schema;
		}
		table_name += (!table_name.empty() ? "." : "") + table;
		return table_name;
	}